

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O1

void print_db_stats(fdb_file_handle **dbfiles,int nfiles)

{
  stat_history_t *psVar1;
  char *pcVar2;
  iterator __position;
  fdb_status fVar3;
  StatAggregator *this;
  char *__s;
  ulong uVar4;
  long lVar5;
  fdb_latency_stat stat;
  ulong local_50;
  fdb_latency_stat local_48;
  
  this = (StatAggregator *)operator_new(0x10);
  StatAggregator::StatAggregator(this,0x13,1);
  lVar5 = 0;
  do {
    __s = fdb_latency_stat_name((fdb_latency_stat_type)lVar5);
    psVar1 = this->t_stats[lVar5];
    pcVar2 = (char *)(psVar1->name)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)__s);
    if (0 < nfiles) {
      uVar4 = 0;
      do {
        local_48.lat_count = 0;
        local_48.lat_min = 0;
        local_48.lat_max = 0;
        local_48._16_8_ = 0;
        fVar3 = fdb_get_latency_stats(dbfiles[uVar4],&local_48,(fdb_latency_stat_type)lVar5);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                        ,0x41,"void print_db_stats(fdb_file_handle **, int)");
        }
        if (local_48.lat_count != 0) {
          psVar1 = this->t_stats[lVar5];
          local_50 = local_48._16_8_ & 0xffffffff;
          __position._M_current =
               (psVar1->latencies).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (psVar1->latencies).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(&psVar1->latencies,__position,&local_50);
          }
          else {
            *__position._M_current = local_50;
            (psVar1->latencies).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        uVar4 = uVar4 + 1;
      } while ((uint)nfiles != uVar4);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x13);
  StatAggregator::aggregateAndPrintStats(this,"FDB_STATS",nfiles,"ms");
  StatAggregator::~StatAggregator(this);
  operator_delete(this);
  return;
}

Assistant:

void print_db_stats(fdb_file_handle **dbfiles, int nfiles) {

    int i, j;
    fdb_status status;
    fdb_latency_stat stat;
    int nstats = FDB_LATENCY_NUM_STATS;

    StatAggregator *sa = new StatAggregator(nstats, 1);

    for (i = 0; i < nstats; i++) {
        const char* name = fdb_latency_stat_name(i);
        sa->t_stats[i][0].name = name;

        for (j = 0; j < nfiles; j++) {
            memset(&stat, 0, sizeof(fdb_latency_stat));
            status = fdb_get_latency_stats(dbfiles[j], &stat, i);
            assert(status == FDB_RESULT_SUCCESS);

            if (stat.lat_count > 0) {
                sa->t_stats[i][0].latencies.push_back(stat.lat_avg);
            }
        }
    }
    (void)status;

    sa->aggregateAndPrintStats("FDB_STATS", nfiles, "ms");
    delete sa;
}